

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

bool __thiscall htmlcxx2::HTML::Node::attribute(Node *this,string *key,string *value)

{
  int iVar1;
  size_type sVar2;
  char *s1;
  char *s2;
  const_reference pvVar3;
  size_t l;
  size_t i;
  string *value_local;
  string *key_local;
  Node *this_local;
  
  l = 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->attributeKeys_);
  while( true ) {
    if (sVar2 <= l) {
      return false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->attributeKeys_,l);
    s1 = (char *)std::__cxx11::string::c_str();
    s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = impl::icompare<char>(s1,s2);
    if (iVar1 == 0) break;
    l = l + 1;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->attributeValues_,l);
  std::__cxx11::string::operator=((string *)value,(string *)pvVar3);
  return true;
}

Assistant:

inline bool Node::attribute(const std::string &key, std::string &value) const
{
    for (size_t i = 0, l = attributeKeys_.size(); i < l; ++i)
    {
        if (impl::icompare(attributeKeys_[i].c_str(), key.c_str()) == 0)
        {
            value = attributeValues_[i];
            return true;
        }
    }
    return false;
}